

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svm_helper.c
# Opt level: O0

void helper_vmsave_x86_64(CPUX86State *env,int aflag)

{
  CPUState *cs_00;
  uintptr_t unaff_retaddr;
  ulong local_28;
  target_ulong addr;
  CPUState *cs;
  int aflag_local;
  CPUX86State *env_local;
  
  cs_00 = env_cpu(env);
  cpu_svm_check_intercept_param_x86_64(env,0x83,0,unaff_retaddr);
  if (aflag == 2) {
    local_28 = env->regs[0];
  }
  else {
    local_28 = env->regs[0] & 0xffffffff;
  }
  svm_save_seg(env,local_28 + 0x440,env->segs + 4);
  svm_save_seg(env,local_28 + 0x450,env->segs + 5);
  svm_save_seg(env,local_28 + 0x490,&env->tr);
  svm_save_seg(env,local_28 + 0x470,&env->ldt);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x620,env->kernelgsbase);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x608,env->lstar);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x610,env->cstar);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x618,env->fmask);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x600,env->star);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x628,(ulong)env->sysenter_cs);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x630,env->sysenter_esp);
  x86_stq_phys_x86_64(cs_00,local_28 + 0x638,env->sysenter_eip);
  return;
}

Assistant:

void helper_vmsave(CPUX86State *env, int aflag)
{
    CPUState *cs = env_cpu(env);
    target_ulong addr;

    cpu_svm_check_intercept_param(env, SVM_EXIT_VMSAVE, 0, GETPC());

    if (aflag == 2) {
        addr = env->regs[R_EAX];
    } else {
        addr = (uint32_t)env->regs[R_EAX];
    }

    // qemu_log_mask(CPU_LOG_TB_IN_ASM, "vmsave! " TARGET_FMT_lx
    //               "\nFS: %016" PRIx64 " | " TARGET_FMT_lx "\n",
    //               addr, x86_ldq_phys(cs,
    //                              addr + offsetof(struct vmcb, save.fs.base)),
    //               env->segs[R_FS].base);

    svm_save_seg(env, addr + offsetof(struct vmcb, save.fs),
                 &env->segs[R_FS]);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.gs),
                 &env->segs[R_GS]);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.tr),
                 &env->tr);
    svm_save_seg(env, addr + offsetof(struct vmcb, save.ldtr),
                 &env->ldt);

#ifdef TARGET_X86_64
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.kernel_gs_base),
             env->kernelgsbase);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.lstar), env->lstar);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.cstar), env->cstar);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sfmask), env->fmask);
#endif
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.star), env->star);
    x86_stq_phys(cs,
             addr + offsetof(struct vmcb, save.sysenter_cs), env->sysenter_cs);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sysenter_esp),
             env->sysenter_esp);
    x86_stq_phys(cs, addr + offsetof(struct vmcb, save.sysenter_eip),
             env->sysenter_eip);
}